

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::async_callable::operator()(async_callable *this)

{
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
             this,in_RSI);
  return (var)(proxy *)this;
}

Assistant:

var operator()() const noexcept
			{
				try {
					return func.call(args);
				}
				catch (const lang_error &le) {
					std::cerr << "await thread terminated after throwing an instance of runtime exception" << std::endl;
					std::cerr << "what(): " << le.what() << std::endl;
				}
				catch (const std::exception &e) {
					std::cerr << "await thread terminated after throwing an instance of exception" << std::endl;
					std::cerr << "what(): " << e.what() << std::endl;
				}
				catch (...) {
					std::cerr << "await thread terminated after throwing an instance of unknown exception" << std::endl;
				}
				return null_pointer;
			}